

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginDragDropTarget(void)

{
  uint uVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImGuiID IVar5;
  ImRect *pIVar6;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if ((((GImGui->DragDropActive == true) &&
       (uVar1 = (GImGui->LastItemData).StatusFlags, (uVar1 & 1) != 0)) &&
      (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
     ((this = GImGui->CurrentWindow,
      this->RootWindow == GImGui->HoveredWindowUnderMovingWindow->RootWindow &&
      (this->SkipItems == false)))) {
    uVar4 = (uVar1 & 2) << 4;
    pIVar6 = (ImRect *)
             ((long)&(((ImGuiLastItemData *)(&GImGui->NextItemData + 1))->Rect).Min.x + (ulong)uVar4
             );
    IVar5 = (GImGui->LastItemData).ID;
    if (IVar5 == 0) {
      IVar5 = ImGuiWindow::GetIDFromRectangle(this,pIVar6);
      if (pIVar3->ActiveId == IVar5) {
        pIVar3->ActiveIdIsAlive = IVar5;
      }
      if (pIVar3->ActiveIdPreviousFrame == IVar5) {
        pIVar3->ActiveIdPreviousFrameIsAlive = true;
      }
    }
    if ((pIVar3->DragDropPayload).SourceId != IVar5) {
      IVar2 = *(ImVec2 *)
               ((long)&(((ImGuiLastItemData *)(&pIVar3->NextItemData + 1))->Rect).Max.x +
               (ulong)uVar4);
      (pIVar3->DragDropTargetRect).Min = pIVar6->Min;
      (pIVar3->DragDropTargetRect).Max = IVar2;
      pIVar6 = &this->ClipRect;
      if ((uVar1 >> 9 & 1) != 0) {
        pIVar6 = &(pIVar3->LastItemData).ClipRect;
      }
      IVar2 = pIVar6->Max;
      (pIVar3->DragDropTargetClipRect).Min = pIVar6->Min;
      (pIVar3->DragDropTargetClipRect).Max = IVar2;
      pIVar3->DragDropTargetId = IVar5;
      pIVar3->DragDropWithinTarget = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
    {
        id = window->GetIDFromRectangle(display_rect);
        KeepAliveID(id);
    }
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false && g.DragDropWithinSource == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetClipRect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasClipRect) ? g.LastItemData.ClipRect : window->ClipRect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}